

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O2

int32_t xor_uint16(uint16_t *array_1,int32_t card_1,uint16_t *array_2,int32_t card_2,uint16_t *out)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  uVar5 = 0;
  iVar4 = 0;
  iVar7 = 0;
  do {
    lVar8 = 0;
    while( true ) {
      iVar3 = (int)lVar8;
      if ((card_1 <= iVar7 + iVar3) || (card_2 <= iVar4 + iVar3)) {
        if (iVar7 + iVar3 < card_1) {
          iVar6 = (card_1 - iVar7) - iVar3;
          iVar4 = iVar7;
        }
        else {
          if (card_2 <= iVar4 + iVar3) {
            return uVar5;
          }
          iVar6 = (card_2 - iVar4) - iVar3;
          array_1 = array_2;
        }
        memcpy(out + uVar5,array_1 + (iVar4 + iVar3),(long)iVar6 * 2);
        return iVar6 + uVar5;
      }
      uVar1 = array_1[iVar7 + lVar8];
      uVar2 = array_2[iVar4 + lVar8];
      if (uVar1 != uVar2) break;
      lVar8 = lVar8 + 1;
    }
    if (uVar1 < uVar2) {
      iVar4 = iVar4 + iVar3;
      out[uVar5] = uVar1;
      iVar7 = iVar3 + iVar7 + 1;
    }
    else {
      iVar7 = iVar7 + iVar3;
      out[uVar5] = uVar2;
      iVar4 = iVar4 + iVar3 + 1;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int32_t xor_uint16(const uint16_t *array_1, int32_t card_1,
                   const uint16_t *array_2, int32_t card_2, uint16_t *out) {
    int32_t pos1 = 0, pos2 = 0, pos_out = 0;
    while (pos1 < card_1 && pos2 < card_2) {
        const uint16_t v1 = array_1[pos1];
        const uint16_t v2 = array_2[pos2];
        if (v1 == v2) {
            ++pos1;
            ++pos2;
            continue;
        }
        if (v1 < v2) {
            out[pos_out++] = v1;
            ++pos1;
        } else {
            out[pos_out++] = v2;
            ++pos2;
        }
    }
    if (pos1 < card_1) {
        const size_t n_elems = card_1 - pos1;
        memcpy(out + pos_out, array_1 + pos1, n_elems * sizeof(uint16_t));
        pos_out += (int32_t)n_elems;
    } else if (pos2 < card_2) {
        const size_t n_elems = card_2 - pos2;
        memcpy(out + pos_out, array_2 + pos2, n_elems * sizeof(uint16_t));
        pos_out += (int32_t)n_elems;
    }
    return pos_out;
}